

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

string * el::base::utils::Str::replaceAll(string *str,string *replaceWhat,string *replaceWith)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  
  __n = replaceWhat->_M_string_length;
  if ((__n != replaceWith->_M_string_length) ||
     ((__n != 0 &&
      (iVar1 = bcmp((replaceWhat->_M_dataplus)._M_p,(replaceWith->_M_dataplus)._M_p,__n), iVar1 != 0
      )))) {
    for (uVar2 = ::std::__cxx11::string::find((char *)str,(ulong)(replaceWhat->_M_dataplus)._M_p,0);
        uVar2 != 0xffffffffffffffff;
        uVar2 = ::std::__cxx11::string::find
                          ((char *)str,(ulong)(replaceWhat->_M_dataplus)._M_p,uVar2 + 1)) {
      ::std::__cxx11::string::replace
                ((ulong)str,uVar2,(char *)replaceWhat->_M_string_length,
                 (ulong)(replaceWith->_M_dataplus)._M_p);
    }
  }
  return str;
}

Assistant:

std::string& Str::replaceAll(std::string& str, const std::string& replaceWhat,
                             const std::string& replaceWith) {
  if (replaceWhat == replaceWith)
    return str;
  std::size_t foundAt = std::string::npos;
  while ((foundAt = str.find(replaceWhat, foundAt + 1)) != std::string::npos) {
    str.replace(foundAt, replaceWhat.length(), replaceWith);
  }
  return str;
}